

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O1

Abc_Ntk_t * Io_ReadPla(char *pFileName,int fZeros,int fBoth,int fCheck)

{
  char cVar1;
  uint *puVar2;
  bool bVar3;
  FILE *pFile;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Extra_FileReader_t *p;
  char *pcVar8;
  Abc_Ntk_t *pNtk;
  ProgressBar *p_00;
  void *pvVar9;
  void *__ptr;
  undefined8 *puVar10;
  void *pvVar11;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *pVVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  int i;
  Abc_Obj_t *pAVar17;
  Mem_Flex_t *pMan;
  uint uVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  uint local_f0;
  uint local_ec;
  int local_c4;
  char local_98 [104];
  
  p = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t|");
  if (p != (Extra_FileReader_t *)0x0) {
    iVar7 = 0;
    pcVar8 = Extra_FileReaderGetFileName(p);
    pNtk = Abc_NtkStartRead(pcVar8);
    pFile = _stdout;
    iVar4 = Extra_FileReaderGetFileSize(p);
    p_00 = Extra_ProgressBarStart(pFile,iVar4);
    pvVar9 = Extra_FileReaderGetTokens(p);
    if (pvVar9 == (void *)0x0) {
      local_c4 = -1;
      __ptr = (void *)0x0;
    }
    else {
      local_c4 = -1;
      iVar7 = 0;
      local_f0 = 0xffffffff;
      local_ec = 0xffffffff;
      __ptr = (void *)0x0;
      do {
        while( true ) {
          iVar4 = Extra_FileReaderGetCurPosition(p);
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar4)) {
            Extra_ProgressBarUpdate_int(p_00,iVar4,(char *)0x0);
          }
          uVar5 = Extra_FileReaderGetLineNumber(p,0);
          puVar10 = *(undefined8 **)((long)pvVar9 + 8);
          pcVar8 = (char *)*puVar10;
          iVar4 = strncmp(pcVar8,".e",2);
          if (iVar4 == 0) goto LAB_002d52f4;
          iVar4 = strncmp(pcVar8,".type",5);
          if (iVar4 != 0) break;
LAB_002d49fd:
          pvVar9 = Extra_FileReaderGetTokens(p);
          if (pvVar9 == (void *)0x0) goto LAB_002d52f4;
        }
        iVar4 = strcmp(pcVar8,".model");
        if (iVar4 == 0) {
          if (pNtk->pName != (char *)0x0) {
            free(pNtk->pName);
            pNtk->pName = (char *)0x0;
          }
          pcVar8 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar9 + 8) + 8));
          pNtk->pName = pcVar8;
          goto LAB_002d49fd;
        }
        iVar4 = *(int *)((long)pvVar9 + 4);
        if (iVar4 == 1) {
          pcVar8 = Extra_FileReaderGetFileName(p);
          pcVar14 = "%s (line %d): Wrong number of token.\n";
LAB_002d54de:
          printf(pcVar14,pcVar8,(ulong)uVar5);
LAB_002d54ea:
          Abc_NtkDelete(pNtk);
          Extra_ProgressBarStop(p_00);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          pNtk = (Abc_Ntk_t *)0x0;
          goto LAB_002d5482;
        }
        iVar6 = strcmp(pcVar8,".i");
        if (iVar6 == 0) {
          local_ec = atoi((char *)puVar10[1]);
        }
        else {
          iVar6 = strcmp(pcVar8,".o");
          if (iVar6 == 0) {
            local_f0 = atoi((char *)puVar10[1]);
          }
          else {
            iVar6 = strcmp(pcVar8,".p");
            if (iVar6 == 0) {
              local_c4 = atoi((char *)puVar10[1]);
            }
            else {
              iVar6 = strcmp(pcVar8,".ilb");
              if (iVar6 == 0) {
                if (iVar4 - 1U != local_ec) {
                  printf(
                        "Warning: Mismatch between the number of PIs on the .i line (%d) and the number of PIs on the .ilb line (%d).\n"
                        );
                }
                if (1 < *(int *)((long)pvVar9 + 4)) {
                  lVar16 = 1;
                  do {
                    Io_ReadCreatePi(pNtk,*(char **)(*(long *)((long)pvVar9 + 8) + lVar16 * 8));
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < *(int *)((long)pvVar9 + 4));
                }
              }
              else {
                iVar6 = strcmp(pcVar8,".ob");
                if (iVar6 != 0) {
                  if (pNtk->vPis->nSize == 0) {
                    if (local_ec != 0xffffffff) {
                      uVar13 = (ulong)local_ec;
                      if (1 < local_ec) {
                        uVar13 = 0;
                        uVar18 = local_ec - 1;
                        if (local_ec - 1 != 0) {
                          do {
                            uVar13 = (ulong)((int)uVar13 + 1);
                            bVar3 = 9 < uVar18;
                            uVar18 = uVar18 / 10;
                          } while (bVar3);
                        }
                      }
                      if (0 < (int)local_ec) {
                        uVar15 = 0;
                        do {
                          sprintf(local_98,"x%0*d",uVar13,uVar15);
                          Io_ReadCreatePi(pNtk,local_98);
                          uVar18 = (int)uVar15 + 1;
                          uVar15 = (ulong)uVar18;
                        } while (local_ec != uVar18);
                      }
                      goto LAB_002d4b38;
                    }
                    pcVar8 = Extra_FileReaderGetFileName(p);
                    pcVar14 = "%s: The number of inputs is not specified.\n";
LAB_002d55bf:
                    printf(pcVar14,pcVar8);
                    Abc_NtkDelete(pNtk);
                    Extra_ProgressBarStop(p_00);
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                  }
                  else {
LAB_002d4b38:
                    if (pNtk->vPos->nSize == 0) {
                      if (local_f0 == 0xffffffff) {
                        pcVar8 = Extra_FileReaderGetFileName(p);
                        pcVar14 = "%s: The number of outputs is not specified.\n";
                        goto LAB_002d55bf;
                      }
                      uVar13 = (ulong)local_f0;
                      if (1 < local_f0) {
                        uVar13 = 0;
                        uVar18 = local_f0 - 1;
                        if (local_f0 - 1 != 0) {
                          do {
                            uVar13 = (ulong)((int)uVar13 + 1);
                            bVar3 = 9 < uVar18;
                            uVar18 = uVar18 / 10;
                          } while (bVar3);
                        }
                      }
                      if (0 < (int)local_f0) {
                        uVar15 = 0;
                        do {
                          sprintf(local_98,"z%0*d",uVar13,uVar15);
                          Io_ReadCreatePo(pNtk,local_98);
                          uVar18 = (int)uVar15 + 1;
                          uVar15 = (ulong)uVar18;
                        } while (local_f0 != uVar18);
                      }
                    }
                    if (pNtk->nObjCounts[7] == 0) {
                      __ptr = malloc((long)(int)local_f0 << 3);
                      pVVar12 = pNtk->vPos;
                      if (0 < pVVar12->nSize) {
                        lVar16 = 0;
                        do {
                          pAVar17 = (Abc_Obj_t *)pVVar12->pArray[lVar16];
                          puVar10 = (undefined8 *)malloc(0x10);
                          *puVar10 = 100;
                          pvVar11 = malloc(100);
                          puVar10[1] = pvVar11;
                          *(undefined8 **)((long)__ptr + lVar16 * 8) = puVar10;
                          pFanin = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
                          if (pAVar17->pNtk->ntkType == ABC_NTK_NETLIST) {
                            pAVar17 = (Abc_Obj_t *)
                                      pAVar17->pNtk->vObjs->pArray[*(pAVar17->vFanins).pArray];
                          }
                          Abc_ObjAddFanin(pAVar17,pFanin);
                          pVVar12 = pNtk->vPis;
                          if (0 < pVVar12->nSize) {
                            lVar21 = 0;
                            do {
                              pAVar17 = (Abc_Obj_t *)pVVar12->pArray[lVar21];
                              if (pAVar17->pNtk->ntkType == ABC_NTK_NETLIST) {
                                pAVar17 = (Abc_Obj_t *)
                                          pAVar17->pNtk->vObjs->pArray[*(pAVar17->vFanouts).pArray];
                              }
                              Abc_ObjAddFanin(pFanin,pAVar17);
                              lVar21 = lVar21 + 1;
                              pVVar12 = pNtk->vPis;
                            } while (lVar21 < pVVar12->nSize);
                          }
                          lVar16 = lVar16 + 1;
                          pVVar12 = pNtk->vPos;
                        } while (lVar16 < pVVar12->nSize);
                      }
                    }
                    if (*(int *)((long)pvVar9 + 4) != 2) {
                      pcVar8 = Extra_FileReaderGetFileName(p);
                      pcVar14 = "%s (line %d): Input and output cubes are not specified.\n";
                      goto LAB_002d54de;
                    }
                    pcVar8 = (char *)**(undefined8 **)((long)pvVar9 + 8);
                    pcVar14 = (char *)(*(undefined8 **)((long)pvVar9 + 8))[1];
                    sVar20 = strlen(pcVar8);
                    if (local_ec == (uint)sVar20) {
                      sVar20 = strlen(pcVar14);
                      if (local_f0 != (uint)sVar20) {
                        pcVar8 = Extra_FileReaderGetFileName(p);
                        sVar20 = strlen(pcVar14);
                        printf("%s (line %d): Output cube length (%d) differs from the number of outputs (%d).\n"
                               ,pcVar8,(ulong)uVar5,sVar20 & 0xffffffff,(ulong)local_f0);
                        goto LAB_002d54ea;
                      }
                      if (fBoth == 0) {
                        if (fZeros == 0) {
                          if (0 < (int)local_f0) {
                            uVar13 = 0;
                            do {
                              if (pcVar14[uVar13] == '1') {
                                puVar2 = *(uint **)((long)__ptr + uVar13 * 8);
                                sVar20 = strlen(pcVar8);
                                if (0 < (int)(uint)sVar20) {
                                  uVar15 = 0;
                                  do {
                                    cVar1 = pcVar8[uVar15];
                                    uVar5 = *puVar2;
                                    if (puVar2[1] == uVar5) {
                                      if ((int)uVar5 < 0x10) {
                                        if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                          pvVar9 = malloc(0x10);
                                        }
                                        else {
                                          pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
                                        }
                                        sVar19 = 0x10;
                                      }
                                      else {
                                        sVar19 = (ulong)uVar5 * 2;
                                        if ((int)sVar19 <= (int)uVar5) goto LAB_002d51d8;
                                        if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                          pvVar9 = malloc(sVar19);
                                        }
                                        else {
                                          pvVar9 = realloc(*(void **)(puVar2 + 2),sVar19);
                                        }
                                      }
                                      *(void **)(puVar2 + 2) = pvVar9;
                                      *puVar2 = (uint)sVar19;
                                    }
LAB_002d51d8:
                                    uVar5 = puVar2[1];
                                    puVar2[1] = uVar5 + 1;
                                    *(char *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = cVar1;
                                    uVar15 = uVar15 + 1;
                                  } while (((uint)sVar20 & 0x7fffffff) != uVar15);
                                }
                                puVar2 = *(uint **)((long)__ptr + uVar13 * 8);
                                lVar16 = 0;
                                do {
                                  cVar1 = ".names n%0*d\n 1\n"[lVar16 + 0xd];
                                  uVar5 = *puVar2;
                                  if (puVar2[1] == uVar5) {
                                    if ((int)uVar5 < 0x10) {
                                      if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                        pvVar9 = malloc(0x10);
                                      }
                                      else {
                                        pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
                                      }
                                      sVar20 = 0x10;
                                    }
                                    else {
                                      sVar20 = (ulong)uVar5 * 2;
                                      if ((int)sVar20 <= (int)uVar5) goto LAB_002d5277;
                                      if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                        pvVar9 = malloc(sVar20);
                                      }
                                      else {
                                        pvVar9 = realloc(*(void **)(puVar2 + 2),sVar20);
                                      }
                                    }
                                    *(void **)(puVar2 + 2) = pvVar9;
                                    *puVar2 = (uint)sVar20;
                                  }
LAB_002d5277:
                                  uVar5 = puVar2[1];
                                  puVar2[1] = uVar5 + 1;
                                  *(char *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = cVar1;
                                  lVar16 = lVar16 + 1;
                                } while (lVar16 != 3);
                              }
                              uVar13 = uVar13 + 1;
                            } while (uVar13 != local_f0);
                          }
                        }
                        else if (0 < (int)local_f0) {
                          uVar13 = 0;
                          do {
                            if (pcVar14[uVar13] == '0') {
                              puVar2 = *(uint **)((long)__ptr + uVar13 * 8);
                              sVar20 = strlen(pcVar8);
                              if (0 < (int)(uint)sVar20) {
                                uVar15 = 0;
                                do {
                                  cVar1 = pcVar8[uVar15];
                                  uVar5 = *puVar2;
                                  if (puVar2[1] == uVar5) {
                                    if ((int)uVar5 < 0x10) {
                                      if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                        pvVar9 = malloc(0x10);
                                      }
                                      else {
                                        pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
                                      }
                                      sVar19 = 0x10;
                                    }
                                    else {
                                      sVar19 = (ulong)uVar5 * 2;
                                      if ((int)sVar19 <= (int)uVar5) goto LAB_002d503a;
                                      if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                        pvVar9 = malloc(sVar19);
                                      }
                                      else {
                                        pvVar9 = realloc(*(void **)(puVar2 + 2),sVar19);
                                      }
                                    }
                                    *(void **)(puVar2 + 2) = pvVar9;
                                    *puVar2 = (uint)sVar19;
                                  }
LAB_002d503a:
                                  uVar5 = puVar2[1];
                                  puVar2[1] = uVar5 + 1;
                                  *(char *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = cVar1;
                                  uVar15 = uVar15 + 1;
                                } while (((uint)sVar20 & 0x7fffffff) != uVar15);
                              }
                              puVar2 = *(uint **)((long)__ptr + uVar13 * 8);
                              lVar16 = 0;
                              do {
                                cVar1 = ".names n%0*d\n 1\n"[lVar16 + 0xd];
                                uVar5 = *puVar2;
                                if (puVar2[1] == uVar5) {
                                  if ((int)uVar5 < 0x10) {
                                    if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                      pvVar9 = malloc(0x10);
                                    }
                                    else {
                                      pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
                                    }
                                    sVar20 = 0x10;
                                  }
                                  else {
                                    sVar20 = (ulong)uVar5 * 2;
                                    if ((int)sVar20 <= (int)uVar5) goto LAB_002d50d9;
                                    if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                      pvVar9 = malloc(sVar20);
                                    }
                                    else {
                                      pvVar9 = realloc(*(void **)(puVar2 + 2),sVar20);
                                    }
                                  }
                                  *(void **)(puVar2 + 2) = pvVar9;
                                  *puVar2 = (uint)sVar20;
                                }
LAB_002d50d9:
                                uVar5 = puVar2[1];
                                puVar2[1] = uVar5 + 1;
                                *(char *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = cVar1;
                                lVar16 = lVar16 + 1;
                              } while (lVar16 != 3);
                            }
                            uVar13 = uVar13 + 1;
                          } while (uVar13 != local_f0);
                        }
                      }
                      else if (0 < (int)local_f0) {
                        uVar13 = 0;
                        do {
                          if ((pcVar14[uVar13] & 0xfeU) == 0x30) {
                            puVar2 = *(uint **)((long)__ptr + uVar13 * 8);
                            sVar20 = strlen(pcVar8);
                            if (0 < (int)(uint)sVar20) {
                              uVar15 = 0;
                              do {
                                cVar1 = pcVar8[uVar15];
                                uVar5 = *puVar2;
                                if (puVar2[1] == uVar5) {
                                  if ((int)uVar5 < 0x10) {
                                    if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                      pvVar9 = malloc(0x10);
                                    }
                                    else {
                                      pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
                                    }
                                    sVar19 = 0x10;
                                  }
                                  else {
                                    sVar19 = (ulong)uVar5 * 2;
                                    if ((int)sVar19 <= (int)uVar5) goto LAB_002d4dc5;
                                    if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                      pvVar9 = malloc(sVar19);
                                    }
                                    else {
                                      pvVar9 = realloc(*(void **)(puVar2 + 2),sVar19);
                                    }
                                  }
                                  *(void **)(puVar2 + 2) = pvVar9;
                                  *puVar2 = (uint)sVar19;
                                }
LAB_002d4dc5:
                                uVar5 = puVar2[1];
                                puVar2[1] = uVar5 + 1;
                                *(char *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = cVar1;
                                uVar15 = uVar15 + 1;
                              } while (((uint)sVar20 & 0x7fffffff) != uVar15);
                            }
                            puVar2 = *(uint **)((long)__ptr + uVar13 * 8);
                            lVar16 = 0;
                            do {
                              cVar1 = ".names n%0*d\n 1\n"[lVar16 + 0xd];
                              uVar5 = *puVar2;
                              if (puVar2[1] == uVar5) {
                                if ((int)uVar5 < 0x10) {
                                  if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                    pvVar9 = malloc(0x10);
                                  }
                                  else {
                                    pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
                                  }
                                  sVar20 = 0x10;
                                }
                                else {
                                  sVar20 = (ulong)uVar5 * 2;
                                  if ((int)sVar20 <= (int)uVar5) goto LAB_002d4e64;
                                  if (*(void **)(puVar2 + 2) == (void *)0x0) {
                                    pvVar9 = malloc(sVar20);
                                  }
                                  else {
                                    pvVar9 = realloc(*(void **)(puVar2 + 2),sVar20);
                                  }
                                }
                                *(void **)(puVar2 + 2) = pvVar9;
                                *puVar2 = (uint)sVar20;
                              }
LAB_002d4e64:
                              uVar5 = puVar2[1];
                              puVar2[1] = uVar5 + 1;
                              *(char *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = cVar1;
                              lVar16 = lVar16 + 1;
                            } while (lVar16 != 3);
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar13 != local_f0);
                      }
                      iVar7 = iVar7 + 1;
                      goto LAB_002d52c3;
                    }
                    pcVar14 = Extra_FileReaderGetFileName(p);
                    sVar20 = strlen(pcVar8);
                    printf("%s (line %d): Input cube length (%d) differs from the number of inputs (%d).\n"
                           ,pcVar14,(ulong)uVar5,sVar20 & 0xffffffff,(ulong)local_ec);
                    Abc_NtkDelete(pNtk);
                  }
                  pNtk = (Abc_Ntk_t *)0x0;
                  goto LAB_002d5482;
                }
                if (iVar4 - 1U != local_f0) {
                  printf(
                        "Warning: Mismatch between the number of POs on the .o line (%d) and the number of POs on the .ob line (%d).\n"
                        );
                }
                if (1 < *(int *)((long)pvVar9 + 4)) {
                  lVar16 = 1;
                  do {
                    Io_ReadCreatePo(pNtk,*(char **)(*(long *)((long)pvVar9 + 8) + lVar16 * 8));
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < *(int *)((long)pvVar9 + 4));
                }
              }
            }
          }
        }
LAB_002d52c3:
        pvVar9 = Extra_FileReaderGetTokens(p);
      } while (pvVar9 != (void *)0x0);
    }
LAB_002d52f4:
    Extra_ProgressBarStop(p_00);
    if (iVar7 != local_c4 && local_c4 != -1) {
      printf("Warning: Mismatch between the number of cubes (%d) and the number on .p line (%d).\n")
      ;
    }
    pVVar12 = pNtk->vPos;
    if (0 < pVVar12->nSize) {
      lVar16 = 0;
      do {
        pAVar17 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*pVVar12->pArray[lVar16] + 0x20) + 8) +
                   (long)**(int **)((long)pVVar12->pArray[lVar16] + 0x20) * 8);
        if (pAVar17->pNtk->ntkType == ABC_NTK_NETLIST) {
          pAVar17 = (Abc_Obj_t *)pAVar17->pNtk->vObjs->pArray[*(pAVar17->vFanins).pArray];
        }
        puVar2 = *(uint **)((long)__ptr + lVar16 * 8);
        if (puVar2[1] == 0) {
          Abc_ObjRemoveFanins(pAVar17);
          pMan = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar8 = " 0\n";
        }
        else {
          uVar5 = *puVar2;
          if (puVar2[1] == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x10);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar2 + 2),0x10);
              }
              *(void **)(puVar2 + 2) = pvVar9;
              sVar20 = 0x10;
            }
            else {
              sVar20 = (ulong)uVar5 * 2;
              if ((int)sVar20 <= (int)uVar5) goto LAB_002d53f6;
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar9 = malloc(sVar20);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar2 + 2),sVar20);
              }
              *(void **)(puVar2 + 2) = pvVar9;
            }
            *puVar2 = (uint)sVar20;
          }
LAB_002d53f6:
          uVar5 = puVar2[1];
          puVar2[1] = uVar5 + 1;
          *(undefined1 *)(*(long *)(puVar2 + 2) + (long)(int)uVar5) = 0;
          Io_ReadPlaCubePreprocess(*(Vec_Str_t **)((long)__ptr + lVar16 * 8),(int)lVar16,0);
          pMan = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar8 = *(char **)(*(long *)((long)__ptr + lVar16 * 8) + 8);
        }
        pcVar8 = Abc_SopRegister(pMan,pcVar8);
        (pAVar17->field_5).pData = pcVar8;
        pvVar9 = *(void **)((long)__ptr + lVar16 * 8);
        if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar9 + 8));
          *(undefined8 *)((long)pvVar9 + 8) = 0;
        }
        if (pvVar9 != (void *)0x0) {
          free(pvVar9);
        }
        lVar16 = lVar16 + 1;
        pVVar12 = pNtk->vPos;
      } while (lVar16 < pVVar12->nSize);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    Abc_NtkFinalizeRead(pNtk);
LAB_002d5482:
    Extra_FileReaderFree(p);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      if (fCheck == 0) {
        return pNtk;
      }
      iVar7 = Abc_NtkCheckRead(pNtk);
      if (iVar7 != 0) {
        return pNtk;
      }
      puts("Io_ReadPla: The network check has failed.");
      Abc_NtkDelete(pNtk);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadPla( char * pFileName, int fZeros, int fBoth, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t|" );
//    p = Extra_FileReaderAlloc( pFileName, "", "\n\r", " \t|" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadPlaNetwork( p, fZeros, fBoth );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadPla: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}